

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall Catch::Matchers::EndsWithMatcher::match(EndsWithMatcher *this,string *source)

{
  bool bVar1;
  string local_30;
  
  CasedString::adjustString(&local_30,&(this->super_StringMatcherBase).m_comparator,source);
  bVar1 = endsWith(&local_30,&(this->super_StringMatcherBase).m_comparator.m_str);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool EndsWithMatcher::match(std::string const &source) const {
            return endsWith(m_comparator.adjustString(source), m_comparator.m_str);
        }